

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O3

int generate_script_from_number
              (int64_t number,miniscript_node_t *parent,uchar *script,size_t script_len,
              size_t *write_len)

{
  int iVar1;
  size_t bytes_len;
  uchar number_bytes [18];
  uchar auStack_38 [32];
  
  if (parent == (miniscript_node_t *)0x0) {
    if (script_len < 0x12) {
      return -2;
    }
  }
  else {
    if (script_len < 0x12) {
      return -2;
    }
    if (parent->info == (miniscript_item_t *)0x0) {
      return -2;
    }
  }
  if (number == -1) {
    *script = 'O';
  }
  else if (number == 0) {
    *script = '\0';
  }
  else {
    if (0x10 < (ulong)number) {
      bytes_len = scriptint_to_bytes(number,auStack_38);
      if (bytes_len != 0) {
        iVar1 = wally_script_push_from_bytes(auStack_38,bytes_len,0,script,script_len,write_len);
        return iVar1;
      }
      return -2;
    }
    *script = (char)number + 'P';
  }
  *write_len = 1;
  return 0;
}

Assistant:

static int generate_script_from_number(
    int64_t number,
    struct miniscript_node_t *parent,
    unsigned char *script,
    size_t script_len,
    size_t *write_len)
{
    int ret = WALLY_OK;
    if (parent && !parent->info)
        return WALLY_EINVAL;

    if (script_len < DESCRIPTOR_NUMBER_BYTE_MAX_LENGTH)
        return WALLY_EINVAL;

    if (number == 0) {
        script[0] = 0;
        *write_len = 1;
    } else if (number == -1) {
        script[0] = OP_1NEGATE;
        *write_len = 1;
    } else if ((number > 0) && (number <= 16)) {
        script[0] = OP_1 + number - 1;
        *write_len = 1;
    } else {
        unsigned char number_bytes[DESCRIPTOR_NUMBER_BYTE_MAX_LENGTH];
        size_t output_len = scriptint_to_bytes(number, number_bytes);
        if (!output_len)
            return WALLY_EINVAL;

        ret = wally_script_push_from_bytes(number_bytes, output_len, 0,
                                           script, script_len, write_len);
    }
    return ret;
}